

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall ExternalTester::Test(ExternalTester *this,TestList test)

{
  void *pvVar1;
  ostream *poVar2;
  bool local_29;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool pass;
  bool passFourier;
  bool passWavelet;
  bool passLocal;
  bool passGlobal;
  bool passRefine;
  bool passDomain;
  bool passAccel;
  TestList test_local;
  ExternalTester *this_local;
  
  pvVar1 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "---------------------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "       Tasmanian Sparse Grids Module: Functionality Test");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "---------------------------------------------------------------------");
  pvVar1 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  local_15 = true;
  local_16 = true;
  local_17 = true;
  local_18 = true;
  local_19 = true;
  local_1a = true;
  local_1b = true;
  if ((test == test_all) || (test == test_acceleration)) {
    local_15 = testAllAcceleration(this);
  }
  if ((test == test_all) || (test == test_domain)) {
    local_16 = testAllDomain(this);
  }
  if ((test == test_all) || (test == test_refinement)) {
    local_17 = testAllRefinement(this);
  }
  if ((test == test_all) || (test == test_global)) {
    local_18 = testAllGlobal(this);
  }
  if ((test == test_all) || (test == test_local)) {
    local_19 = testAllPWLocal(this);
  }
  if ((test == test_all) || (test == test_wavelet)) {
    local_1a = testAllWavelet(this);
  }
  if ((test == test_all) || (test == test_fourier)) {
    local_1b = testAllFourier(this);
  }
  local_29 = false;
  if ((((local_18 != false) && (local_29 = false, local_19 != false)) &&
      (local_29 = false, local_1a != false)) &&
     (((local_29 = false, local_1b != false && (local_29 = false, local_17 != false)) &&
      (local_29 = false, local_16 != false)))) {
    local_29 = local_15;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if (local_29 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"         Some Tests Have Failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL"
                            );
    pvVar1 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"           All Tests Completed Successfully");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    pvVar1 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  }
  return local_29;
}

Assistant:

bool ExternalTester::Test(TestList test) const{
    cout << endl << endl;
    cout << "---------------------------------------------------------------------" << endl;
    cout << "       Tasmanian Sparse Grids Module: Functionality Test" << endl;
    cout << "---------------------------------------------------------------------" << endl << endl;

    bool passAccel   = true;
    bool passDomain  = true;
    bool passRefine  = true;
    bool passGlobal  = true;
    bool passLocal   = true;
    bool passWavelet = true;
    bool passFourier = true;

    if ((test == test_all) || (test == test_acceleration)) passAccel   = testAllAcceleration();
    if ((test == test_all) || (test == test_domain))       passDomain  = testAllDomain();
    if ((test == test_all) || (test == test_refinement))   passRefine  = testAllRefinement();
    if ((test == test_all) || (test == test_global))       passGlobal  = testAllGlobal();
    if ((test == test_all) || (test == test_local))        passLocal   = testAllPWLocal();
    if ((test == test_all) || (test == test_wavelet))      passWavelet = testAllWavelet();
    if ((test == test_all) || (test == test_fourier))      passFourier = testAllFourier();

    bool pass = passGlobal && passLocal && passWavelet && passFourier && passRefine && passDomain && passAccel;
    //bool pass = true;

    cout << endl;
    if (pass){
        cout << "---------------------------------------------------------------------" << endl;
        cout << "           All Tests Completed Successfully" << endl;
        cout << "---------------------------------------------------------------------" << endl << endl;
    }else{
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl;
        cout << "         Some Tests Have Failed" << endl;
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl << endl;
    }
    return pass;
}